

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

RealType __thiscall
OpenMD::EAM::Zhou2005OxygenFunctional
          (EAM *this,RealType rho,vector<double,_std::allocator<double>_> *OrhoLimits,
          vector<double,_std::allocator<double>_> *OrhoE,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *OF)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  RealType t;
  RealType functional;
  undefined8 local_30;
  
  local_30 = 0.0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
  if (in_XMM0_Qa < *pvVar2) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    dVar4 = in_XMM0_Qa / *pvVar2 - 1.0;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](in_RCX,0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
    local_30 = *pvVar2;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](in_RCX,0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
    dVar1 = *pvVar2;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](in_RCX,0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
    dVar5 = *pvVar2;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](in_RCX,0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,3);
    local_30 = dVar4 * (dVar4 * (dVar4 * *pvVar2 + dVar5) + dVar1) + local_30;
  }
  else {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
    if ((in_XMM0_Qa < *pvVar2) ||
       (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,2),
       *pvVar2 <= in_XMM0_Qa)) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,2);
      if ((in_XMM0_Qa < *pvVar2) ||
         (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,3),
         *pvVar2 <= in_XMM0_Qa)) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,3);
        if ((in_XMM0_Qa < *pvVar2) ||
           (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,4),
           *pvVar2 <= in_XMM0_Qa)) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,4);
          if (*pvVar2 <= in_XMM0_Qa) {
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,4);
            dVar5 = in_XMM0_Qa / *pvVar2 - 1.0;
            pvVar3 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_RCX,4);
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
            local_30 = *pvVar2;
            pvVar3 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_RCX,4);
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
            dVar1 = *pvVar2;
            pvVar3 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_RCX,4);
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
            local_30 = dVar5 * (dVar5 * *pvVar2 + dVar1) + local_30;
          }
        }
        else {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,3);
          dVar5 = in_XMM0_Qa / *pvVar2 - 1.0;
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RCX,3);
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
          local_30 = *pvVar2;
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RCX,3);
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
          dVar1 = *pvVar2;
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RCX,3);
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
          local_30 = dVar5 * (dVar5 * *pvVar2 + dVar1) + local_30;
        }
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,2);
        dVar5 = in_XMM0_Qa / *pvVar2 - 1.0;
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](in_RCX,2);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
        local_30 = *pvVar2;
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](in_RCX,2);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
        dVar1 = *pvVar2;
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](in_RCX,2);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
        local_30 = dVar5 * (dVar5 * *pvVar2 + dVar1) + local_30;
      }
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,1);
      dVar5 = in_XMM0_Qa / *pvVar2 - 1.0;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RCX,1);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
      local_30 = *pvVar2;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RCX,1);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,1);
      dVar1 = *pvVar2;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RCX,1);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,2);
      local_30 = dVar5 * (dVar5 * *pvVar2 + dVar1) + local_30;
    }
  }
  return local_30;
}

Assistant:

RealType EAM::Zhou2005OxygenFunctional(
      RealType rho, std::vector<RealType> OrhoLimits,
      std::vector<RealType> OrhoE, std::vector<std::vector<RealType>> OF) {
    RealType functional(0.0);
    RealType t;

    if (rho < OrhoLimits[1]) {
      t          = rho / OrhoE[0] - 1.0;
      functional = OF[0][0] + t * (OF[0][1] + t * (OF[0][2] + t * OF[0][3]));
    } else if (rho >= OrhoLimits[1] && rho < OrhoLimits[2]) {
      t          = rho / OrhoE[1] - 1.0;
      functional = OF[1][0] + t * (OF[1][1] + t * OF[1][2]);
    } else if (rho >= OrhoLimits[2] && rho < OrhoLimits[3]) {
      t          = rho / OrhoE[2] - 1.0;
      functional = OF[2][0] + t * (OF[2][1] + t * OF[2][2]);
    } else if (rho >= OrhoLimits[3] && rho < OrhoLimits[4]) {
      t          = rho / OrhoE[3] - 1.0;
      functional = OF[3][0] + t * (OF[3][1] + t * OF[3][2]);
    } else if (rho >= OrhoLimits[4]) {
      t          = rho / OrhoE[4] - 1.0;
      functional = OF[4][0] + t * (OF[4][1] + t * OF[4][2]);
    }
    return functional;
  }